

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMU.cpp
# Opt level: O2

void __thiscall RTIMU::calibrateAverageCompass(RTIMU *this)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  RTIMUSettings *pRVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  long lVar11;
  bool bVar12;
  float fVar13;
  float fVar14;
  RTVector3 ev;
  
  if (this->m_compassCalibrationMode != false) goto LAB_001161be;
  pRVar4 = this->m_settings;
  if (pRVar4->m_compassCalValid == false) {
    fVar13 = (this->m_imuData).compass.m_data[0];
    bVar12 = fVar13 != this->m_runtimeMagCalMax[0];
    bVar7 = this->m_runtimeMagCalMax[0] <= fVar13;
    if (bVar7 && bVar12) {
      this->m_runtimeMagCalMax[0] = fVar13;
    }
    fVar14 = (this->m_imuData).compass.m_data[1];
    bVar5 = fVar14 != this->m_runtimeMagCalMax[1];
    bVar8 = this->m_runtimeMagCalMax[1] <= fVar14;
    if (bVar8 && bVar5) {
      this->m_runtimeMagCalMax[1] = fVar14;
    }
    fVar1 = (this->m_imuData).compass.m_data[2];
    bVar6 = fVar1 != this->m_runtimeMagCalMax[2];
    bVar9 = this->m_runtimeMagCalMax[2] <= fVar1;
    if (bVar9 && bVar6) {
      this->m_runtimeMagCalMax[2] = fVar1;
    }
    bVar10 = fVar13 < this->m_runtimeMagCalMin[0];
    if (bVar10) {
      this->m_runtimeMagCalMin[0] = fVar13;
    }
    if (this->m_runtimeMagCalMin[1] <= fVar14) {
      if (fVar1 < this->m_runtimeMagCalMin[2]) goto LAB_00115fb9;
      if (bVar10 || (bVar9 && bVar6 || (bVar8 && bVar5 || bVar7 && bVar12))) goto LAB_00115fc4;
    }
    else {
      this->m_runtimeMagCalMin[1] = fVar14;
      if (fVar1 < this->m_runtimeMagCalMin[2]) {
LAB_00115fb9:
        this->m_runtimeMagCalMin[2] = fVar1;
      }
LAB_00115fc4:
      bVar12 = this->m_runtimeMagCalValid == false;
      if (bVar12) {
        lVar11 = -0xc;
        this->m_runtimeMagCalValid = true;
        do {
          if (lVar11 == 0) goto LAB_00115fd7;
          fVar13 = *(float *)((long)this->m_runtimeMagCalMin + lVar11);
        } while (((0.0 <= fVar13) &&
                 (fVar14 = *(float *)((long)this[1].m_imuData.fusionPose.m_data + lVar11 + -0x1c),
                 fVar14 <= 0.0)) && (lVar11 = lVar11 + 4, 30.0 <= fVar13 - fVar14));
        this->m_runtimeMagCalValid = false;
      }
      else if (!bVar12) {
LAB_00115fd7:
        fVar13 = -1.0;
        for (lVar11 = -0xc; lVar11 != 0; lVar11 = lVar11 + 4) {
          fVar14 = *(float *)((long)this->m_runtimeMagCalMin + lVar11) -
                   *(float *)((long)this[1].m_imuData.fusionPose.m_data + lVar11 + -0x1c);
          if (fVar14 <= fVar13) {
            fVar14 = fVar13;
          }
          fVar13 = fVar14;
        }
        for (lVar11 = -0xc; lVar11 != 0; lVar11 = lVar11 + 4) {
          fVar14 = *(float *)((long)this->m_runtimeMagCalMin + lVar11);
          fVar1 = *(float *)((long)this[1].m_imuData.fusionPose.m_data + lVar11 + -0x1c);
          *(float *)((long)(this->m_compassAverage).m_data + lVar11) =
               (fVar13 * 0.5) / ((fVar14 - fVar1) * 0.5);
          *(float *)((long)this->m_compassCalScale + lVar11) = (fVar14 + fVar1) * 0.5;
        }
      }
    }
    if ((this->m_runtimeMagCalValid & 1U) == 0) goto LAB_001161be;
  }
  uVar2 = *(undefined8 *)(this->m_imuData).compass.m_data;
  *(ulong *)(this->m_imuData).compass.m_data =
       CONCAT44((float)((ulong)*(undefined8 *)this->m_compassCalScale >> 0x20) *
                ((float)((ulong)uVar2 >> 0x20) -
                (float)((ulong)*(undefined8 *)this->m_compassCalOffset >> 0x20)),
                (float)*(undefined8 *)this->m_compassCalScale *
                ((float)uVar2 - (float)*(undefined8 *)this->m_compassCalOffset));
  (this->m_imuData).compass.m_data[2] =
       ((this->m_imuData).compass.m_data[2] - this->m_compassCalOffset[2]) *
       this->m_compassCalScale[2];
  if (pRVar4->m_compassCalEllipsoidValid == true) {
    ev.m_data[2] = (this->m_imuData).compass.m_data[2];
    ev.m_data._0_8_ = *(undefined8 *)(this->m_imuData).compass.m_data;
    RTVector3::operator-=(&ev,&pRVar4->m_compassCalEllipsoidOffset);
    pRVar4 = this->m_settings;
    (this->m_imuData).compass.m_data[0] =
         pRVar4->m_compassCalEllipsoidCorr[0][2] * ev.m_data[2] +
         pRVar4->m_compassCalEllipsoidCorr[0][0] * ev.m_data[0] +
         pRVar4->m_compassCalEllipsoidCorr[0][1] * ev.m_data[1];
    (this->m_imuData).compass.m_data[1] =
         pRVar4->m_compassCalEllipsoidCorr[1][2] * ev.m_data[2] +
         pRVar4->m_compassCalEllipsoidCorr[1][0] * ev.m_data[0] +
         pRVar4->m_compassCalEllipsoidCorr[1][1] * ev.m_data[1];
    (this->m_imuData).compass.m_data[2] =
         ev.m_data[2] * pRVar4->m_compassCalEllipsoidCorr[2][2] +
         ev.m_data[0] * pRVar4->m_compassCalEllipsoidCorr[2][0] +
         ev.m_data[1] * pRVar4->m_compassCalEllipsoidCorr[2][1];
  }
LAB_001161be:
  uVar2 = *(undefined8 *)(this->m_imuData).compass.m_data;
  uVar3 = *(undefined8 *)(this->m_compassAverage).m_data;
  *(ulong *)(this->m_compassAverage).m_data =
       CONCAT44((float)((ulong)uVar3 >> 0x20) * 0.8 + (float)((ulong)uVar2 >> 0x20) * 0.2,
                (float)uVar3 * 0.8 + (float)uVar2 * 0.2);
  (this->m_compassAverage).m_data[2] =
       (this->m_compassAverage).m_data[2] * 0.8 + (this->m_imuData).compass.m_data[2] * 0.2;
  RTVector3::operator=(&(this->m_imuData).compass,&this->m_compassAverage);
  return;
}

Assistant:

void RTIMU::calibrateAverageCompass()
{
    //  see if need to do runtime mag calibration (i.e. no stored calibration data)

    if (!m_compassCalibrationMode && !m_settings->m_compassCalValid) {
        // try runtime calibration
        bool changed = false;

        // see if there is a new max or min

        if (m_runtimeMagCalMax[0] < m_imuData.compass.x()) {
            m_runtimeMagCalMax[0] = m_imuData.compass.x();
            changed = true;
        }
        if (m_runtimeMagCalMax[1] < m_imuData.compass.y()) {
            m_runtimeMagCalMax[1] = m_imuData.compass.y();
            changed = true;
        }
        if (m_runtimeMagCalMax[2] < m_imuData.compass.z()) {
            m_runtimeMagCalMax[2] = m_imuData.compass.z();
            changed = true;
        }

        if (m_runtimeMagCalMin[0] > m_imuData.compass.x()) {
            m_runtimeMagCalMin[0] = m_imuData.compass.x();
            changed = true;
        }
        if (m_runtimeMagCalMin[1] > m_imuData.compass.y()) {
            m_runtimeMagCalMin[1] = m_imuData.compass.y();
            changed = true;
        }
        if (m_runtimeMagCalMin[2] > m_imuData.compass.z()) {
            m_runtimeMagCalMin[2] = m_imuData.compass.z();
            changed = true;
        }

        //  now see if ranges are sufficient

        if (changed) {

            float delta;

            if (!m_runtimeMagCalValid) {
                m_runtimeMagCalValid = true;

                for (int i = 0; i < 3; i++)
                {
                    delta = m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i];
                    if ((delta < RTIMU_RUNTIME_MAGCAL_RANGE) || (m_runtimeMagCalMin[i] > 0) || (m_runtimeMagCalMax[i] < 0))
                    {
                        m_runtimeMagCalValid = false;
                        break;
                    }
                }
            }

            //  find biggest range and scale to that

            if (m_runtimeMagCalValid) {
                float magMaxDelta = -1;

                for (int i = 0; i < 3; i++) {
                    if ((m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i]) > magMaxDelta)
                    {
                        magMaxDelta = m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i];
                    }
                }

                // adjust for + and - range

                magMaxDelta /= 2.0;

                for (int i = 0; i < 3; i++)
                {
                    delta = (m_runtimeMagCalMax[i] - m_runtimeMagCalMin[i]) / 2.0;
                    m_compassCalScale[i] = magMaxDelta / delta;
                    m_compassCalOffset[i] = (m_runtimeMagCalMax[i] + m_runtimeMagCalMin[i]) / 2.0;
                }
            }
        }
    }

    if (getCompassCalibrationValid() || getRuntimeCompassCalibrationValid()) {
        m_imuData.compass.setX((m_imuData.compass.x() - m_compassCalOffset[0]) * m_compassCalScale[0]);
        m_imuData.compass.setY((m_imuData.compass.y() - m_compassCalOffset[1]) * m_compassCalScale[1]);
        m_imuData.compass.setZ((m_imuData.compass.z() - m_compassCalOffset[2]) * m_compassCalScale[2]);

        if (m_settings->m_compassCalEllipsoidValid) {
            RTVector3 ev = m_imuData.compass;
            ev -= m_settings->m_compassCalEllipsoidOffset;

            m_imuData.compass.setX(ev.x() * m_settings->m_compassCalEllipsoidCorr[0][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[0][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[0][2]);

            m_imuData.compass.setY(ev.x() * m_settings->m_compassCalEllipsoidCorr[1][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[1][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[1][2]);

            m_imuData.compass.setZ(ev.x() * m_settings->m_compassCalEllipsoidCorr[2][0] +
                ev.y() * m_settings->m_compassCalEllipsoidCorr[2][1] +
                ev.z() * m_settings->m_compassCalEllipsoidCorr[2][2]);
        }
    }

    //  update running average

    m_compassAverage.setX(m_imuData.compass.x() * COMPASS_ALPHA + m_compassAverage.x() * (1.0 - COMPASS_ALPHA));
    m_compassAverage.setY(m_imuData.compass.y() * COMPASS_ALPHA + m_compassAverage.y() * (1.0 - COMPASS_ALPHA));
    m_compassAverage.setZ(m_imuData.compass.z() * COMPASS_ALPHA + m_compassAverage.z() * (1.0 - COMPASS_ALPHA));

    m_imuData.compass = m_compassAverage;
}